

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O0

void __thiscall llvm::DWARFUnit::updateAddressDieMap(DWARFUnit *this,DWARFDie Die)

{
  _Base_ptr p_Var1;
  ulong uVar2;
  unsigned_long uVar3;
  bool bVar4;
  bool bVar5;
  reference this_00;
  _Self *this_01;
  pointer ppVar6;
  mapped_type *pmVar7;
  undefined1 local_b0 [8];
  DWARFDie Child;
  pair<unsigned_long,_llvm::DWARFDie> local_98;
  _Self local_80;
  _Self local_78;
  iterator B;
  DWARFAddressRange *R;
  iterator __end3;
  iterator __begin3;
  type *__range3;
  undefined1 local_40 [8];
  Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
  DIERangesOrError;
  DWARFUnit *this_local;
  DWARFDie Die_local;
  
  Die_local.U = (DWARFUnit *)Die.Die;
  this_local = Die.U;
  DIERangesOrError._24_8_ = this;
  bVar4 = DWARFDie::isSubroutineDIE((DWARFDie *)&this_local);
  if (bVar4) {
    DWARFDie::getAddressRanges
              ((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
                *)local_40,(DWARFDie *)&this_local);
    bVar4 = llvm::Expected::operator_cast_to_bool((Expected *)local_40);
    if (bVar4) {
      this_00 = Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
                ::get((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
                       *)local_40);
      __end3 = std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::begin
                         (this_00);
      R = (DWARFAddressRange *)
          std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::end
                    (this_00);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<llvm::DWARFAddressRange_*,_std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
                                         *)&R), bVar4) {
        B._M_node = (_Base_ptr)
                    __gnu_cxx::
                    __normal_iterator<llvm::DWARFAddressRange_*,_std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
                    ::operator*(&__end3);
        if (*(_Base_ptr *)B._M_node != (B._M_node)->_M_parent) {
          local_78._M_node =
               (_Base_ptr)
               std::
               map<unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>_>_>_>
               ::upper_bound(&this->AddrDieMap,(key_type_conflict *)B._M_node);
          local_80._M_node =
               (_Base_ptr)
               std::
               map<unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>_>_>_>
               ::begin(&this->AddrDieMap);
          bVar5 = std::operator!=(&local_78,&local_80);
          bVar4 = false;
          if (bVar5) {
            uVar2 = *(ulong *)B._M_node;
            this_01 = std::
                      _Rb_tree_iterator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>_>_>
                      ::operator--(&local_78);
            ppVar6 = std::
                     _Rb_tree_iterator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>_>_>
                     ::operator->(this_01);
            bVar4 = uVar2 < (ppVar6->second).first;
          }
          if (bVar4) {
            p_Var1 = (B._M_node)->_M_parent;
            ppVar6 = std::
                     _Rb_tree_iterator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>_>_>
                     ::operator->(&local_78);
            if (p_Var1 < (_Base_ptr)(ppVar6->second).first) {
              ppVar6 = std::
                       _Rb_tree_iterator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>_>_>
                       ::operator->(&local_78);
              pmVar7 = std::
                       map<unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>_>_>_>
                       ::operator[](&this->AddrDieMap,(key_type_conflict *)&(B._M_node)->_M_parent);
              std::pair<unsigned_long,_llvm::DWARFDie>::operator=(pmVar7,&ppVar6->second);
            }
            uVar2 = *(ulong *)B._M_node;
            ppVar6 = std::
                     _Rb_tree_iterator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>_>_>
                     ::operator->(&local_78);
            if (ppVar6->first < uVar2) {
              uVar3 = *(unsigned_long *)B._M_node;
              ppVar6 = std::
                       _Rb_tree_iterator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>_>_>
                       ::operator->(&local_78);
              pmVar7 = std::
                       map<unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>_>_>_>
                       ::operator[](&this->AddrDieMap,&ppVar6->first);
              pmVar7->first = uVar3;
            }
          }
          std::make_pair<unsigned_long_const&,llvm::DWARFDie&>
                    (&local_98,(unsigned_long *)&(B._M_node)->_M_parent,(DWARFDie *)&this_local);
          pmVar7 = std::
                   map<unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>_>_>_>
                   ::operator[](&this->AddrDieMap,(key_type_conflict *)B._M_node);
          std::pair<unsigned_long,_llvm::DWARFDie>::operator=(pmVar7,&local_98);
        }
        __gnu_cxx::
        __normal_iterator<llvm::DWARFAddressRange_*,_std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
        ::operator++(&__end3);
      }
    }
    else {
      Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>::
      takeError((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
                 *)&Child.Die);
      consumeError((Error *)&Child.Die);
      Error::~Error((Error *)&Child.Die);
    }
    Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>::
    ~Expected((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
               *)local_40);
  }
  _local_b0 = DWARFDie::getFirstChild((DWARFDie *)&this_local);
  while (bVar4 = DWARFDie::operator_cast_to_bool((DWARFDie *)local_b0), bVar4) {
    updateAddressDieMap(this,_local_b0);
    _local_b0 = DWARFDie::getSibling((DWARFDie *)local_b0);
  }
  return;
}

Assistant:

void DWARFUnit::updateAddressDieMap(DWARFDie Die) {
  if (Die.isSubroutineDIE()) {
    auto DIERangesOrError = Die.getAddressRanges();
    if (DIERangesOrError) {
      for (const auto &R : DIERangesOrError.get()) {
        // Ignore 0-sized ranges.
        if (R.LowPC == R.HighPC)
          continue;
        auto B = AddrDieMap.upper_bound(R.LowPC);
        if (B != AddrDieMap.begin() && R.LowPC < (--B)->second.first) {
          // The range is a sub-range of existing ranges, we need to split the
          // existing range.
          if (R.HighPC < B->second.first)
            AddrDieMap[R.HighPC] = B->second;
          if (R.LowPC > B->first)
            AddrDieMap[B->first].first = R.LowPC;
        }
        AddrDieMap[R.LowPC] = std::make_pair(R.HighPC, Die);
      }
    } else
      llvm::consumeError(DIERangesOrError.takeError());
  }
  // Parent DIEs are added to the AddrDieMap prior to the Children DIEs to
  // simplify the logic to update AddrDieMap. The child's range will always
  // be equal or smaller than the parent's range. With this assumption, when
  // adding one range into the map, it will at most split a range into 3
  // sub-ranges.
  for (DWARFDie Child = Die.getFirstChild(); Child; Child = Child.getSibling())
    updateAddressDieMap(Child);
}